

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  REF_STATUS RVar5;
  double dVar6;
  double dVar7;
  
  RVar5 = 3;
  if (0.0 < observation) {
    dVar6 = ref_histogram->max;
    if (ref_histogram->max <= observation) {
      dVar6 = observation;
    }
    ref_histogram->max = dVar6;
    dVar6 = ref_histogram->min;
    if (observation <= ref_histogram->min) {
      dVar6 = observation;
    }
    ref_histogram->min = dVar6;
    dVar6 = log2(observation);
    ref_histogram->log_total = dVar6 + ref_histogram->log_total;
    dVar6 = ref_histogram->exp;
    dVar7 = log2(observation);
    iVar2 = ref_histogram->nbin;
    uVar3 = (uint)((double)(iVar2 / 2) + dVar7 * dVar6);
    RVar5 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar1 = iVar2 - 1;
    if (iVar2 <= (int)uVar3) {
      uVar3 = uVar1;
    }
    if ((int)uVar1 <= (int)uVar3) {
      uVar3 = uVar1;
    }
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    ref_histogram->bins[uVar4] = ref_histogram->bins[uVar4] + 1;
    if ((FILE *)ref_histogram->df != (FILE *)0x0) {
      fprintf((FILE *)ref_histogram->df,"%f\n",observation);
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,
                                     REF_DBL observation) {
  REF_INT i;

  if (observation <= 0.0) return REF_INVALID;

  ref_histogram_max(ref_histogram) =
      MAX(ref_histogram_max(ref_histogram), observation);
  ref_histogram_min(ref_histogram) =
      MIN(ref_histogram_min(ref_histogram), observation);
  ref_histogram_log_total(ref_histogram) += log2(observation);

  i = ref_histogram_to_bin(ref_histogram, observation);
  i = MIN(i, ref_histogram_nbin(ref_histogram) - 1);
  i = MAX(i, 0);

  ref_histogram_bin(ref_histogram, i)++;

  if (NULL != ref_histogram->df)
    fprintf(ref_histogram->df, "%f\n", observation);

  return REF_SUCCESS;
}